

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O3

void __thiscall Liby::TcpServer::TcpServer(TcpServer *this,EventLoop *loop)

{
  _Head_base<0UL,_Liby::Poller_*,_false> _Var1;
  
  TimerMixin::TimerMixin(&this->super_TimerMixin);
  (this->super_TimerMixin)._vptr_TimerMixin = (_func_int **)&PTR__TcpServer_0012ea30;
  this->listenfd_ = -1;
  (this->socket_).super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->socket_).super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  _Var1._M_head_impl =
       (loop->poller_)._M_t.super___uniq_ptr_impl<Liby::Poller,_std::default_delete<Liby::Poller>_>.
       _M_t.super__Tuple_impl<0UL,_Liby::Poller_*,_std::default_delete<Liby::Poller>_>.
       super__Head_base<0UL,_Liby::Poller_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (Poller *)0x0) {
    this->poller_ = _Var1._M_head_impl;
    this->loop_ = loop;
    (this->chan_)._M_t.super___uniq_ptr_impl<Liby::Channel,_std::default_delete<Liby::Channel>_>.
    _M_t.super__Tuple_impl<0UL,_Liby::Channel_*,_std::default_delete<Liby::Channel>_>.
    super__Head_base<0UL,_Liby::Channel_*,_false>._M_head_impl = (Channel *)0x0;
    *(undefined8 *)&(this->acceptorCallback_).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(this->acceptorCallback_).super__Function_base._M_functor + 8) = 0;
    (this->acceptorCallback_).super__Function_base._M_manager = (_Manager_type)0x0;
    (this->acceptorCallback_)._M_invoker = (_Invoker_type)0x0;
    *(undefined8 *)&(this->readEventCallback_).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(this->readEventCallback_).super__Function_base._M_functor + 8) = 0;
    (this->readEventCallback_).super__Function_base._M_manager = (_Manager_type)0x0;
    (this->readEventCallback_)._M_invoker = (_Invoker_type)0x0;
    *(undefined8 *)&(this->erroEventCallback_).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(this->erroEventCallback_).super__Function_base._M_functor + 8) = 0;
    (this->erroEventCallback_).super__Function_base._M_manager = (_Manager_type)0x0;
    (this->erroEventCallback_)._M_invoker = (_Invoker_type)0x0;
    return;
  }
  __assert_fail("poller_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/EventLoop.h"
                ,0xf,"Poller *Liby::EventLoop::getPoller() const");
}

Assistant:

TcpServer::TcpServer(EventLoop *loop)
    : poller_(loop->getPoller()), loop_(loop) {}